

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

TRef kfold_xload(jit_State *J,IRIns *ir,void *p)

{
  TRef TVar1;
  
  switch((ir->field_1).t.irt & 0x1f) {
  case 0xe:
    TVar1 = lj_ir_knum_u64(J,*p);
    return TVar1;
  case 0xf:
    TVar1 = lj_ir_kint(J,(int)*p);
    return TVar1;
  case 0x10:
    TVar1 = lj_ir_kint(J,(uint)*p);
    return TVar1;
  case 0x11:
    TVar1 = lj_ir_kint(J,(int)*p);
    return TVar1;
  case 0x12:
    TVar1 = lj_ir_kint(J,(uint)*p);
    return TVar1;
  case 0x13:
  case 0x14:
    TVar1 = lj_ir_kint(J,*p);
    return TVar1;
  case 0x15:
  case 0x16:
    TVar1 = lj_ir_kint64(J,*p);
    return TVar1;
  default:
    return 0;
  }
}

Assistant:

static TRef kfold_xload(jit_State *J, IRIns *ir, const void *p)
{
  int32_t k;
  switch (irt_type(ir->t)) {
  case IRT_NUM: return lj_ir_knum_u64(J, *(uint64_t *)p);
  case IRT_I8: k = (int32_t)*(int8_t *)p; break;
  case IRT_U8: k = (int32_t)*(uint8_t *)p; break;
  case IRT_I16: k = (int32_t)(int16_t)lj_getu16(p); break;
  case IRT_U16: k = (int32_t)(uint16_t)lj_getu16(p); break;
  case IRT_INT: case IRT_U32: k = (int32_t)lj_getu32(p); break;
  case IRT_I64: case IRT_U64: return lj_ir_kint64(J, *(uint64_t *)p);
  default: return 0;
  }
  return lj_ir_kint(J, k);
}